

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

Maybe<kj::Own<const_kj::ReadableFile>_> __thiscall
kj::anon_unknown_35::InMemoryDirectory::tryOpenFile(InMemoryDirectory *this,PathPtr path)

{
  uint uVar1;
  long lVar2;
  Impl *pIVar3;
  Maybe<const_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&> MVar4;
  long in_RCX;
  undefined8 *puVar5;
  ReadableFile *extraout_RDX;
  char *pcVar6;
  ReadableFile *extraout_RDX_00;
  ReadableFile *extraout_RDX_01;
  ReadableFile *pRVar7;
  void *in_R8;
  Maybe<kj::Own<const_kj::ReadableFile>_> MVar8;
  StringPtr name;
  StringPtr name_00;
  PathPtr path_00;
  Fault f;
  ReadableDirectory *pRStack_50;
  Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  void *__child_stack;
  
  puVar5 = (undefined8 *)path.parts.size_;
  name_00.content.ptr = path.parts.ptr;
  if (in_RCX == 1) {
    _::Mutex::lock((Mutex *)(name_00.content.ptr + 1),SHARED);
    lock.ptr = (Impl *)(name_00.content.ptr + 2);
    lVar2 = puVar5[1];
    if (lVar2 == 0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (char *)*puVar5;
    }
    name.content.size_ = lVar2 + (ulong)(lVar2 == 0);
    name.content.ptr = pcVar6;
    lock.mutex = (Mutex *)(name_00.content.ptr + 1);
    MVar4 = Impl::tryGetEntry(lock.ptr,name);
    if (MVar4.ptr == (EntryImpl *)0x0) {
      (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
      (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
    }
    else {
      uVar1 = ((MVar4.ptr)->node).tag;
      if (uVar1 == 3) {
        SymlinkNode::parse((Path *)&f,(SymlinkNode *)&((MVar4.ptr)->node).field_1);
        Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl>::release(&lock);
        path_00.parts.size_ = (size_t)f.exception;
        path_00.parts.ptr = name_00.content.ptr;
        tryOpenFile(this,path_00);
        Array<kj::String>::~Array((Array<kj::String> *)&f);
      }
      else if (uVar1 == 1) {
        File::clone((File *)&f,*(__fn **)((long)&((MVar4.ptr)->node).field_1 + 8),__child_stack,1,
                    in_R8);
        (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
             (_func_int **)f.exception;
        (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)pRStack_50;
        Own<const_kj::File>::dispose((Own<const_kj::File> *)&f);
      }
      else {
        _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[11]>
                  (&f,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0x63f,FAILED,(char *)0x0,"\"not a file\"",(char (*) [11])"not a file");
        (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
             (_func_int **)0x0;
        (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
        _::Debug::Fault::~Fault(&f);
      }
    }
    Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl>::~Locked(&lock);
    pRVar7 = extraout_RDX_01;
  }
  else if (in_RCX == 0) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[11]>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x42f,FAILED,(char *)0x0,"\"not a file\"",(char (*) [11])"not a file");
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
    (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
    _::Debug::Fault::~Fault(&f);
    pRVar7 = extraout_RDX;
  }
  else {
    if (puVar5[1] == 0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (char *)*puVar5;
    }
    name_00.content.size_ = (size_t)pcVar6;
    tryGetParent((InMemoryDirectory *)&lock,name_00);
    pIVar3 = lock.ptr;
    f.exception = (Exception *)lock.mutex;
    lock.ptr = (Impl *)0x0;
    Own<const_kj::ReadableDirectory>::dispose((Own<const_kj::ReadableDirectory> *)&lock);
    if (pIVar3 == (Impl *)0x0) {
      (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
      (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
    }
    else {
      (*(code *)pIVar3->clock[10]._vptr_Clock)(this,pIVar3,puVar5 + 3,in_RCX + -1);
    }
    Own<const_kj::ReadableDirectory>::dispose((Own<const_kj::ReadableDirectory> *)&f);
    pRVar7 = extraout_RDX_00;
  }
  MVar8.ptr.ptr = pRVar7;
  MVar8.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<const_kj::ReadableFile>_>)MVar8.ptr;
}

Assistant:

Maybe<Own<const ReadableFile>> tryOpenFile(PathPtr path) const override {
    if (path.size() == 0) {
      KJ_FAIL_REQUIRE("not a file") { return nullptr; }
    } else if (path.size() == 1) {
      auto lock = impl.lockShared();
      KJ_IF_MAYBE(entry, lock->tryGetEntry(path[0])) {
        return asFile(lock, *entry);
      } else {
        return nullptr;
      }
    } else {
      KJ_IF_MAYBE(subdir, tryGetParent(path[0])) {
        return subdir->get()->tryOpenFile(path.slice(1, path.size()));
      } else {
        return nullptr;
      }
    }
  }